

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O2

void ExtractTranslationSampler
               (Asset *asset,string *animId,Ref<glTF2::Buffer> *buffer,aiNodeAnim *nodeChannel,
               float ticksPerSecond,Sampler *sampler)

{
  uint uVar1;
  aiVectorKey *paVar2;
  ulong uVar3;
  ulong uVar4;
  ulong __n;
  Ref<glTF2::Accessor> RVar5;
  allocator_type local_65;
  float local_64;
  vector<float,_std::allocator<float>_> values;
  vector<float,_std::allocator<float>_> times;
  
  uVar1 = nodeChannel->mNumPositionKeys;
  __n = (ulong)uVar1;
  if (__n != 0) {
    local_64 = ticksPerSecond;
    std::vector<float,_std::allocator<float>_>::vector(&times,__n,(allocator_type *)&values);
    std::vector<float,_std::allocator<float>_>::vector(&values,(ulong)(uVar1 * 3),&local_65);
    uVar3 = 0;
    for (uVar4 = 0; __n != uVar4; uVar4 = uVar4 + 1) {
      paVar2 = nodeChannel->mPositionKeys;
      times.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar4] = (float)((&paVar2->mTime)[uVar3] / (double)local_64);
      values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar3 & 0xffffffff] = (&(paVar2->mValue).x)[uVar3 * 2];
      values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[(int)uVar3 + 1] = (&(paVar2->mValue).y)[uVar3 * 2];
      values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[(int)uVar3 + 2] = (&(paVar2->mValue).z)[uVar3 * 2];
      uVar3 = uVar3 + 3;
    }
    RVar5 = GetSamplerInputRef(asset,animId,buffer,&times);
    (sampler->input).vector = RVar5.vector;
    (sampler->input).index = RVar5.index;
    RVar5 = ExportData(asset,animId,buffer,__n,
                       values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,VEC3,VEC3,ComponentType_FLOAT,false);
    (sampler->output).vector = RVar5.vector;
    (sampler->output).index = RVar5.index;
    sampler->interpolation = Interpolation_LINEAR;
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&values.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&times.super__Vector_base<float,_std::allocator<float>_>);
  }
  return;
}

Assistant:

inline void ExtractTranslationSampler(Asset& asset, std::string& animId, Ref<Buffer>& buffer, const aiNodeAnim* nodeChannel, float ticksPerSecond, Animation::Sampler& sampler)
{
    const unsigned int numKeyframes = nodeChannel->mNumPositionKeys;
    if (numKeyframes == 0) {
        return;
    }

    std::vector<float> times(numKeyframes);
    std::vector<float> values(numKeyframes * 3);
    for (unsigned int i = 0; i < numKeyframes; ++i) {
        const aiVectorKey& key = nodeChannel->mPositionKeys[i];
        // mTime is measured in ticks, but GLTF time is measured in seconds, so convert.
        times[i] = static_cast<float>(key.mTime / ticksPerSecond);
        values[(i * 3) + 0] = key.mValue.x;
        values[(i * 3) + 1] = key.mValue.y;
        values[(i * 3) + 2] = key.mValue.z;
    }

    sampler.input = GetSamplerInputRef(asset, animId, buffer, times);
    sampler.output = ExportData(asset, animId, buffer, numKeyframes, &values[0], AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
    sampler.interpolation = Interpolation_LINEAR;
}